

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O2

int __thiscall
dlib::mfp_kernel_1_base_class<0UL>::
mp_impl_T<dlib::member_function_pointer<void,_void,_void,_void>::mp_impl<dlib::message_box_helper::blocking_box_win>_>
::clone(mp_impl_T<dlib::member_function_pointer<void,_void,_void,_void>::mp_impl<dlib::message_box_helper::blocking_box_win>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 uVar1;
  
  *(void **)(__fn + 8) =
       (this->super_mp_impl<dlib::message_box_helper::blocking_box_win>).super_mp_base.
       super_mp_base_base.o;
  *(undefined4 *)(__fn + 0x10) = 0;
  uVar1 = *(undefined8 *)
           &(this->super_mp_impl<dlib::message_box_helper::blocking_box_win>).field_0x20;
  *(mfp_pointer_type *)(__fn + 0x18) =
       (this->super_mp_impl<dlib::message_box_helper::blocking_box_win>).callback;
  *(undefined8 *)(__fn + 0x20) = uVar1;
  *(undefined ***)__fn = &PTR__mp_base_base_00338920;
  return 0x338920;
}

Assistant:

void clone   (void* ptr) const  { new(ptr) mp_impl_T(this->o,this->callback); }